

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

bool __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::update(raw_quasi_adaptive_huffman_data_model *this)

{
  byte bVar1;
  uint uVar2;
  unsigned_short *puVar3;
  uint16 *puVar4;
  uint8 *puVar5;
  decoder_tables *pTables;
  long lVar6;
  bool bVar7;
  uint uVar8;
  undefined8 in_RAX;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined8 uStack_20;
  undefined8 local_18;
  uint max_code_size;
  uint total_freq;
  
  uVar8 = this->m_total_count + this->m_update_cycle;
  if (0x7fff < uVar8) {
    uVar8 = this->m_total_syms;
    if ((ulong)uVar8 == 0) {
      uVar8 = 0;
    }
    else {
      puVar3 = (this->m_sym_freq).m_p;
      uVar9 = 0;
      uVar11 = 0;
      do {
        do {
          uVar12 = puVar3[uVar9] + 1 >> 1;
          uVar10 = uVar11 + uVar12;
          puVar3[uVar9] = (unsigned_short)uVar12;
          uVar9 = uVar9 + 1;
          uVar11 = uVar10;
        } while (uVar9 != uVar8);
        if (uVar10 < 0x8000) break;
        uVar9 = 0;
        uVar11 = 0;
      } while (uVar8 != 0);
      uVar8 = 0;
      if (uVar10 < 0x8000) {
        uVar8 = uVar10;
      }
    }
  }
  this->m_total_count = uVar8;
  local_18 = in_RAX;
  if (this->m_use_polar_codes == true) {
    uStack_20 = 0x11db6e;
    uVar8 = get_generate_polar_codes_table_size();
  }
  else {
    uStack_20 = 0x11db75;
    uVar8 = get_generate_huffman_codes_table_size();
  }
  lVar6 = -((ulong)uVar8 + 0xf & 0xfffffffffffffff0);
  uVar2 = this->m_total_syms;
  puVar4 = (this->m_sym_freq).m_p;
  puVar5 = (this->m_code_sizes).m_p;
  if (this->m_use_polar_codes == true) {
    *(undefined8 *)((long)&uStack_20 + lVar6) = 0x11dba5;
    bVar7 = generate_polar_codes
                      ((void *)((long)&local_18 + lVar6),uVar2,puVar4,puVar5,(uint *)&local_18,
                       (uint *)((long)&local_18 + 4));
  }
  else {
    *(undefined8 *)((long)&uStack_20 + lVar6) = 0x11dbb4;
    bVar7 = generate_huffman_codes
                      ((void *)((long)&local_18 + lVar6),uVar2,puVar4,puVar5,(uint *)&local_18,
                       (uint *)((long)&local_18 + 4));
  }
  if ((bVar7 != false) && (local_18._4_4_ == this->m_total_count)) {
    if (0x10 < (uint)local_18) {
      uVar2 = this->m_total_syms;
      puVar5 = (this->m_code_sizes).m_p;
      *(undefined8 *)((long)&uStack_20 + lVar6) = 0x11dbd7;
      bVar7 = prefix_coding::limit_max_code_size(uVar2,puVar5,0x10);
      if (!bVar7) {
        return false;
      }
    }
    uVar2 = this->m_total_syms;
    puVar5 = (this->m_code_sizes).m_p;
    if (this->m_encoding == true) {
      puVar4 = (this->m_codes).m_p;
      *(undefined8 *)((long)&uStack_20 + lVar6) = 0x11dbf1;
      bVar7 = prefix_coding::generate_codes(uVar2,puVar5,puVar4);
    }
    else {
      pTables = this->m_pDecode_tables;
      bVar1 = this->m_decoder_table_bits;
      *(undefined8 *)((long)&uStack_20 + lVar6) = 0x11dc00;
      bVar7 = prefix_coding::generate_decoder_tables(uVar2,puVar5,pTables,(uint)bVar1);
    }
    if (bVar7 != false) {
      uVar8 = this->m_update_cycle * 2;
      if (this->m_fast_updating == false) {
        uVar8 = this->m_update_cycle * 5 >> 2;
      }
      if (this->m_max_cycle <= uVar8) {
        uVar8 = this->m_max_cycle;
      }
      this->m_update_cycle = uVar8;
      this->m_symbols_until_update = uVar8;
      return true;
    }
  }
  return false;
}

Assistant:

bool raw_quasi_adaptive_huffman_data_model::update()
   {
      LZHAM_ASSERT(!m_symbols_until_update);
      m_total_count += m_update_cycle;
      LZHAM_ASSERT(m_total_count <= 65535);

      while (m_total_count >= 32768)
         rescale();

      uint table_size = m_use_polar_codes ? get_generate_polar_codes_table_size() : get_generate_huffman_codes_table_size();
      void *pTables = alloca(table_size);

      uint max_code_size, total_freq;
      bool status;
      if (m_use_polar_codes)
         status = generate_polar_codes(pTables, m_total_syms, &m_sym_freq[0], &m_code_sizes[0], max_code_size, total_freq);
      else
         status = generate_huffman_codes(pTables, m_total_syms, &m_sym_freq[0], &m_code_sizes[0], max_code_size, total_freq);
      LZHAM_ASSERT(status);
      LZHAM_ASSERT(total_freq == m_total_count);
      if ((!status) || (total_freq != m_total_count))
         return false;

      if (max_code_size > prefix_coding::cMaxExpectedCodeSize)
      {
         bool status = prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], prefix_coding::cMaxExpectedCodeSize);
         LZHAM_ASSERT(status);
         if (!status)
            return false;
      }

      if (m_encoding)
         status = prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]);
      else
         status = prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, m_decoder_table_bits);

      LZHAM_ASSERT(status);
      if (!status)
         return false;

      if (m_fast_updating)
         m_update_cycle = 2 * m_update_cycle;
      else
         m_update_cycle = (5 * m_update_cycle) >> 2;

      if (m_update_cycle > m_max_cycle)
         m_update_cycle = m_max_cycle;

      m_symbols_until_update = m_update_cycle;

      return true;
   }